

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::QuadMeshNode> *mesh,ssize_t id)

{
  bool bVar1;
  size_t sVar2;
  int in_EDX;
  int __oflag;
  int __oflag_00;
  long *in_RSI;
  XMLWriter *in_RDI;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1_1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range1;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_00000240;
  XMLWriter *in_stack_00000248;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffdd8;
  avector<Vec3fa> *in_stack_fffffffffffffde0;
  allocator *paVar3;
  allocator *in_stack_fffffffffffffde8;
  XMLWriter *in_stack_fffffffffffffdf0;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  reference local_178;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_170;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_168;
  long local_160;
  undefined1 local_151 [40];
  allocator local_129;
  string local_128 [32];
  reference local_108;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *local_100;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_f8;
  long local_f0;
  allocator local_e1;
  string local_e0 [32];
  long *local_c0 [3];
  allocator local_a1;
  string local_a0 [32];
  int local_80;
  long *local_68;
  long **local_60;
  long **local_58;
  
  local_80 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"QuadMesh",&local_a1);
  open(in_RDI,(char *)local_a0,local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_68 = (long *)(*in_RSI + 0xd0);
  local_60 = local_c0;
  local_c0[0] = (long *)*local_68;
  if (local_c0[0] != (long *)0x0) {
    (**(code **)(*local_c0[0] + 0x10))();
  }
  store(in_stack_00000248,in_stack_00000240);
  local_58 = local_c0;
  if (local_c0[0] != (long *)0x0) {
    (**(code **)(*local_c0[0] + 0x18))();
  }
  sVar2 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x3edc0a);
  if (sVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"animated_positions",&local_e1);
    open(in_RDI,(char *)local_e0,__oflag);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  local_f0 = *in_RSI + 0x70;
  local_f8._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  local_100 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::end(in_stack_fffffffffffffdd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                ::operator*(&local_f8);
    store(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_f8);
  }
  sVar2 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x3ede22);
  if (sVar2 != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"animated_positions",&local_129);
    close(in_RDI,(int)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  sVar2 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x3edeef);
  if (sVar2 != 1) {
    in_stack_fffffffffffffdf0 = (XMLWriter *)local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_151 + 1),"animated_normals",(allocator *)in_stack_fffffffffffffdf0);
    open(in_RDI,local_151 + 1,__oflag_00);
    std::__cxx11::string::~string((string *)(local_151 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_151);
  }
  local_160 = *in_RSI + 0x88;
  local_168._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  local_170 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::end(in_stack_fffffffffffffdd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffde0,
                       (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)in_stack_fffffffffffffdd8);
    if (!bVar1) break;
    local_178 = __gnu_cxx::
                __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                ::operator*(&local_168);
    store(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    __gnu_cxx::
    __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_168);
  }
  sVar2 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x3ee064);
  if (sVar2 != 1) {
    in_stack_fffffffffffffde8 = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"animated_normals",in_stack_fffffffffffffde8);
    close(in_RDI,(int)local_198);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  store<embree::Vec2<float>>
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffffde0);
  store<embree::SceneGraph::QuadMeshNode::Quad>
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
             (vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              *)in_stack_fffffffffffffde0);
  paVar3 = &local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"QuadMesh",paVar3);
  close(in_RDI,(int)local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::QuadMeshNode> mesh, ssize_t id) 
  {
    open("QuadMesh",id);
    store(mesh->material);
    
    if (mesh->numTimeSteps() != 1) open("animated_positions");
    for (const auto& p : mesh->positions) store("positions",p);
    if (mesh->numTimeSteps() != 1) close("animated_positions");

    if (mesh->numTimeSteps() != 1) open("animated_normals");
    for (const auto& p : mesh->normals) store("normals",p);
    if (mesh->numTimeSteps() != 1) close("animated_normals");
    
    store("texcoords",mesh->texcoords);
    store("indices",mesh->quads);
    close("QuadMesh");
  }